

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(cmCTestCoverageHandlerLocale *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmCTestCoverageHandlerLocale *local_10;
  cmCTestCoverageHandlerLocale *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_30,"LC_ALL=",&this->lc_all);
    cmsys::SystemTools::PutEnv(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    cmSystemTools::UnsetEnv("LC_ALL");
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~cmCTestCoverageHandlerLocale()
  {
    if (!lc_all.empty()) {
      cmSystemTools::PutEnv("LC_ALL=" + lc_all);
    } else {
      cmSystemTools::UnsetEnv("LC_ALL");
    }
  }